

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcentricFinder.h
# Opt level: O1

int __thiscall
ZXing::CheckSymmetricPattern<true,ZXing::FixedPattern<5,7,false>>
          (ZXing *this,BitMatrixCursorI *cur,FixedPattern<5,_7,_false> pattern,int range,
          bool updatePosition)

{
  long lVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint8_t *puVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  uint8_t *puVar14;
  uint uVar15;
  uint uVar16;
  double dVar17;
  Pattern<pattern_size()>_conflict res;
  FastEdgeToEdgeCounter curBwd;
  FastEdgeToEdgeCounter curFwd;
  undefined1 local_a8 [24];
  int local_90;
  uint local_8c;
  int local_84;
  FastEdgeToEdgeCounter local_80;
  BitMatrixCursorI *local_70;
  value_type local_68;
  ulong local_60;
  BitMatrixCursor<ZXing::PointT<int>_> *local_58;
  undefined1 local_50 [16];
  PointT<int> local_40;
  Iterator puStack_38;
  
  local_68 = pattern._data[0];
  local_70 = cur;
  FastEdgeToEdgeCounter::FastEdgeToEdgeCounter(&local_80,(BitMatrixCursorI *)this);
  local_50._0_8_ = *(undefined8 *)this;
  local_50._8_8_ = *(PointT<int> *)(this + 8);
  uVar13 = 0;
  local_40.y = -*(int *)(this + 0x14);
  local_40.x = -*(int *)(this + 0x10);
  FastEdgeToEdgeCounter::FastEdgeToEdgeCounter
            ((FastEdgeToEdgeCounter *)(local_a8 + 0x10),(BitMatrixCursorI *)local_50);
  uVar15 = (uint)CONCAT62((int6)((ulong)register0x00000008 >> 0x10),pattern._data[4]);
  uVar8 = uVar15;
  if (local_80.stepsToBorder < (int)uVar15) {
    uVar8 = local_80.stepsToBorder;
  }
  lVar1 = (long)local_80.stride;
  uVar11 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar11 = uVar13;
  }
  iVar6 = (int)uVar11 + 1;
  puVar9 = local_80.p;
  do {
    puVar9 = puVar9 + lVar1;
    if (uVar11 == uVar13) {
      iVar4 = 0;
      if ((int)uVar15 < local_80.stepsToBorder) goto LAB_0018ac0c;
      goto LAB_0018abf4;
    }
    uVar13 = uVar13 + 1;
  } while (*puVar9 == *local_80.p);
  iVar6 = (int)uVar13;
LAB_0018abf4:
  local_80.p = local_80.p + local_80.stride * iVar6;
  local_80.stepsToBorder = local_80.stepsToBorder - iVar6;
  iVar4 = iVar6;
LAB_0018ac0c:
  if (iVar4 != 0) {
    uVar8 = uVar15;
    if ((int)local_8c < (int)uVar15) {
      uVar8 = local_8c;
    }
    lVar3 = (long)local_90;
    uVar11 = 0;
    uVar13 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar13 = uVar11;
    }
    uVar8 = (int)uVar13 + 1;
    pcVar12 = (char *)local_a8._16_8_;
    do {
      pcVar12 = pcVar12 + lVar3;
      if (uVar13 == uVar11) {
        local_60 = 0;
        if ((int)uVar15 < (int)local_8c) goto LAB_0018ac7a;
        goto LAB_0018ac5e;
      }
      uVar11 = uVar11 + 1;
    } while (*pcVar12 == *(char *)local_a8._16_8_);
    uVar8 = (uint)uVar11;
LAB_0018ac5e:
    local_a8._16_8_ = local_a8._16_8_ + (long)(int)(local_90 * uVar8);
    local_8c = local_8c - uVar8;
    local_60 = (ulong)uVar8;
LAB_0018ac7a:
    if ((int)local_60 != 0) {
      local_a8._8_2_ = 0;
      uVar8 = (iVar4 + (int)local_60) - 1;
      local_a8._0_8_ = (ulong)(ushort)uVar8 << 0x20;
      uVar15 = uVar15 - (uVar8 & 0xffff);
      lVar10 = 1;
      puVar9 = local_80.p;
      pcVar12 = (char *)local_a8._16_8_;
      uVar8 = local_80.stepsToBorder;
      uVar7 = local_8c;
      do {
        uVar16 = uVar15;
        if ((int)uVar8 < (int)uVar15) {
          uVar16 = uVar8;
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        iVar6 = uVar16 + 1;
        uVar13 = 0;
        puVar14 = puVar9;
        do {
          puVar14 = puVar14 + lVar1;
          if (uVar16 == uVar13) {
            iVar4 = 0;
            if ((int)uVar15 < (int)uVar8) goto LAB_0018ad21;
            goto LAB_0018ad08;
          }
          uVar13 = uVar13 + 1;
        } while (*puVar14 == *puVar9);
        iVar6 = (int)uVar13;
LAB_0018ad08:
        uVar8 = uVar8 - iVar6;
        puVar9 = puVar9 + iVar6 * lVar1;
        iVar4 = iVar6;
        local_80.p = puVar9;
        local_80.stepsToBorder = uVar8;
LAB_0018ad21:
        *(short *)(local_a8 + lVar10 * 2 + 4) = (short)iVar4;
        if (iVar4 == 0) {
          return 0;
        }
        uVar15 = uVar15 - iVar4;
        uVar16 = uVar15;
        if ((int)uVar7 < (int)uVar15) {
          uVar16 = uVar7;
        }
        uVar13 = (ulong)uVar16;
        if ((int)uVar16 < 1) {
          uVar13 = 0;
        }
        iVar6 = (int)uVar13 + 1;
        uVar11 = 0;
        pcVar5 = pcVar12;
        do {
          pcVar5 = pcVar5 + lVar3;
          if (uVar13 == uVar11) {
            iVar4 = 0;
            if ((int)uVar15 < (int)uVar7) goto LAB_0018ad8a;
            goto LAB_0018ad72;
          }
          uVar11 = uVar11 + 1;
        } while (*pcVar5 == *pcVar12);
        iVar6 = (int)uVar11;
LAB_0018ad72:
        uVar7 = uVar7 - iVar6;
        pcVar12 = pcVar12 + iVar6 * lVar3;
        iVar4 = iVar6;
        local_a8._16_8_ = pcVar12;
        local_8c = uVar7;
LAB_0018ad8a:
        *(short *)(local_a8 + (uint)((2 - (int)lVar10) * 2)) = (short)iVar4;
        if (iVar4 == 0) {
          return 0;
        }
        uVar15 = uVar15 - iVar4;
        lVar10 = lVar10 + 1;
        if (lVar10 == 3) {
          local_50._8_4_ = 5;
          local_40.x = 0;
          local_40.y = 0;
          puStack_38 = (Iterator)0x0;
          local_84 = range;
          local_58 = (BitMatrixCursor<ZXing::PointT<int>_> *)this;
          local_50._0_8_ = (BitMatrix *)local_a8;
          dVar17 = IsPattern<true,5,7>((PatternView *)local_50,
                                       (FixedPattern<5,_7,_false> *)&local_70,0,0.0,0.0);
          if ((dVar17 == 0.0) && (!NAN(dVar17))) {
            return 0;
          }
          if ((char)local_84 != '\0') {
            BitMatrixCursor<ZXing::PointT<int>_>::step
                      (local_58,((uint)((ushort)local_a8._4_2_ >> 1) - (int)local_60) + 1);
          }
          lVar1 = 0;
          uVar2 = 0;
          do {
            uVar2 = uVar2 + *(short *)(local_a8 + lVar1);
            lVar1 = lVar1 + 2;
          } while (lVar1 != 10);
          return (uint)uVar2;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

int CheckSymmetricPattern(BitMatrixCursorI& cur, PATTERN pattern, int range, bool updatePosition)
{
	FastEdgeToEdgeCounter curFwd(cur), curBwd(cur.turnedBack());

	int centerFwd = curFwd.stepToNextEdge(range);
	if (!centerFwd)
		return 0;
	int centerBwd = curBwd.stepToNextEdge(range);
	if (!centerBwd)
		return 0;

	assert(range > 0);
	Pattern<pattern.size()> res = {};
	auto constexpr s_2 = Size(res)/2;
	res[s_2] = centerFwd + centerBwd - 1; // -1 because the starting pixel is counted twice
	range -= res[s_2];

	auto next = [&](auto& cur, int i) {
		auto v = cur.stepToNextEdge(range);
		res[s_2 + i] = v;
		range -= v;
		return v;
	};

	for (int i = 1; i <= s_2; ++i) {
		if (!next(curFwd, i) || !next(curBwd, -i))
			return 0;
	}

	if (!IsPattern<RELAXED_THRESHOLD>(res, pattern))
		return 0;

	if (updatePosition)
		cur.step(res[s_2] / 2 - (centerBwd - 1));

	return Reduce(res);
}